

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O0

uint64_t make_block_header(uint64_t size,block_type type)

{
  block_type type_local;
  uint64_t size_local;
  
  switch(type) {
  case T_FLONUM:
    size_local = size | 0x100000000000000;
    break;
  case T_CLOSURE:
    size_local = size | 0x400000000000000;
    break;
  case T_PAIR:
    size_local = size | 0x500000000000000;
    break;
  case T_VECTOR:
    size_local = size | 0x600000000000000;
    break;
  case T_STRING:
    size_local = size | 0x200000000000000;
    break;
  case T_PORT:
    size_local = size | 0x700000000000000;
    break;
  case T_PROMISE:
    size_local = size | 0x800000000000000;
    break;
  default:
    size_local = 0;
  }
  return size_local;
}

Assistant:

inline uint64_t make_block_header(uint64_t size, block_type type)
  {
  switch (type)
    {
    case T_FLONUM: return size | ((uint64_t)flonum_tag << block_shift);
    case T_CLOSURE: return size | ((uint64_t)closure_tag << block_shift);
    case T_PAIR: return size | ((uint64_t)pair_tag << block_shift);
    case T_VECTOR: return size | ((uint64_t)vector_tag << block_shift);
    case T_STRING: return size | ((uint64_t)string_tag << block_shift);
    case T_PORT: return size | ((uint64_t)port_tag << block_shift);
    case T_PROMISE: return size | ((uint64_t)promise_tag << block_shift);
    default: return 0;
    }
  }